

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateWeightParamsUpdatable(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint32_t uVar4;
  byte bVar5;
  long *plVar6;
  RepeatedField<unsigned_long> *pRVar7;
  undefined1 *puVar8;
  long *plVar9;
  byte bVar10;
  bool bVar11;
  undefined1 *puVar12;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Result local_88;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  CoreML::Result::Result(&local_88);
  paVar2 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  uVar4 = layer->_oneof_case_[0];
  local_40._M_dataplus._M_p = (pointer)paVar2;
  if (uVar4 == 0x8c) {
    if (uVar4 == 0x8c) {
      puVar8 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar8 = CoreML::Specification::_InnerProductLayerParams_default_instance_;
    }
    bVar5 = ((InnerProductLayerParams *)puVar8)->hasbias_;
    if ((bool)bVar5 == true) {
      puVar12 = (undefined1 *)((InnerProductLayerParams *)puVar8)->bias_;
      if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
        puVar12 = CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar10 = ((WeightParams *)puVar12)->isupdatable_;
      bVar11 = ((WeightParams *)puVar12)->quantization_ != (QuantizationParams *)0x0 &&
               puVar12 != CoreML::Specification::_WeightParams_default_instance_;
    }
    else {
      bVar10 = 0;
      bVar11 = false;
    }
    pRVar7 = &((ConvolutionLayerParams *)puVar8)->kernelsize_;
LAB_00322e3d:
    puVar8 = *(undefined1 **)pRVar7;
    if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
      puVar8 = CoreML::Specification::_WeightParams_default_instance_;
    }
    if ((puVar8 != CoreML::Specification::_WeightParams_default_instance_ &&
         ((WeightParams *)puVar8)->quantization_ != (QuantizationParams *)0x0) || (bVar11)) {
      std::operator+(&local_a8,"An updatable layer, named \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    }
    else {
      if (((byte)(bVar10 | bVar5 ^ 1) == 1) && (((WeightParams *)puVar8)->isupdatable_ != false))
      goto LAB_00322e7b;
      std::operator+(&local_a8,"An updatable layer, named \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    }
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_50 = *plVar9;
      lStack_48 = plVar6[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar9;
      local_60 = (long *)*plVar6;
    }
    local_58 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&local_40);
  }
  else {
    if (uVar4 == 100) {
      if (uVar4 != 100) {
        puVar8 = CoreML::Specification::_ConvolutionLayerParams_default_instance_;
      }
      else {
        puVar8 = *(undefined1 **)&layer->layer_;
      }
      bVar5 = ((ConvolutionLayerParams *)puVar8)->hasbias_;
      if ((bool)bVar5 == true) {
        puVar12 = (undefined1 *)((ConvolutionLayerParams *)puVar8)->bias_;
        if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
          puVar12 = CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar10 = ((WeightParams *)puVar12)->isupdatable_;
        bVar11 = ((WeightParams *)puVar12)->quantization_ != (QuantizationParams *)0x0 &&
                 puVar12 != CoreML::Specification::_WeightParams_default_instance_;
      }
      else {
        bVar10 = 0;
        bVar11 = false;
      }
      pRVar7 = (RepeatedField<unsigned_long> *)&((ConvolutionLayerParams *)puVar8)->weights_;
      goto LAB_00322e3d;
    }
LAB_00322e7b:
    paVar3 = &local_88.m_message.field_2;
    __return_storage_ptr__->m_type = local_88.m_type;
    __return_storage_ptr__->m_reason = local_88.m_reason;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.m_message._M_dataplus._M_p == paVar3) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_88.m_message.field_2._M_allocated_capacity._1_7_,
                    local_88.m_message.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
           local_88.m_message.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_88.m_message._M_dataplus._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_88.m_message.field_2._M_allocated_capacity._1_7_,
                    local_88.m_message.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_88.m_message._M_string_length;
    local_88.m_message._M_string_length = 0;
    local_88.m_message.field_2._M_local_buf[0] = '\0';
    local_88.m_message._M_dataplus._M_p = (pointer)paVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.m_message._M_dataplus._M_p != &local_88.m_message.field_2) {
    operator_delete(local_88.m_message._M_dataplus._M_p,
                    CONCAT71(local_88.m_message.field_2._M_allocated_capacity._1_7_,
                             local_88.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateWeightParamsUpdatable(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    
    bool weight_update_flag = false;
    bool bias_update_flag = false;
    bool has_bias = false;
    bool weights_are_quantized = false;
    bool bias_is_quantized = false;
    
    std::string err;
    
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            has_bias = layer.convolution().hasbias();
            if (has_bias) {
                bias_update_flag = layer.convolution().bias().isupdatable();
                bias_is_quantized = layer.convolution().bias().has_quantization();
            }
            weights_are_quantized = layer.convolution().weights().has_quantization();
            weight_update_flag = layer.convolution().weights().isupdatable();
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            has_bias = layer.innerproduct().hasbias();
            if (has_bias) {
                bias_update_flag = layer.innerproduct().bias().isupdatable();
                bias_is_quantized = layer.innerproduct().bias().has_quantization();
            }
            weights_are_quantized = layer.innerproduct().weights().has_quantization();
            weight_update_flag = layer.innerproduct().weights().isupdatable();
            break;
        default:
            return r;
    }

    if (weights_are_quantized || bias_is_quantized) {
        err = "An updatable layer, named '" + layer.name() + "', has quantized weights/bias param. Quantized weights/bias not supported for update.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    if (!weight_update_flag || ((has_bias) && (!bias_update_flag))) {
        err = "An updatable layer, named '" + layer.name() + "', has a weight/bias param which is not marked as updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}